

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.h
# Opt level: O0

bool __thiscall HttpRequest::SetMethod(HttpRequest *this,char *start,char *end)

{
  Method MVar1;
  bool bVar2;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string temp_method;
  char *end_local;
  char *start_local;
  HttpRequest *this_local;
  
  temp_method.field_2._8_8_ = end;
  if (this->_method != Invalid) {
    __assert_fail("_method == Invalid",
                  "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/test/http/http_request.h"
                  ,0x29,"bool HttpRequest::SetMethod(const char *, const char *)");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>((string *)local_40,start,end,&local_41);
  std::allocator<char>::~allocator(&local_41);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,"GET");
  if (bVar2) {
    this->_method = Get;
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"POST");
    if (bVar2) {
      this->_method = Post;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"HEAD");
      if (bVar2) {
        this->_method = Head;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"PUT");
        if (bVar2) {
          this->_method = Put;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40,"DELETE");
          if (bVar2) {
            this->_method = Delete;
          }
          else {
            this->_method = Invalid;
          }
        }
      }
    }
  }
  MVar1 = this->_method;
  std::__cxx11::string::~string((string *)local_40);
  return MVar1 != Invalid;
}

Assistant:

bool SetMethod(const char* start, const char* end) {
    assert(_method == Invalid);
    std::string temp_method(start, end);
    if (temp_method == "GET") {
      _method = Get;

    } else if (temp_method == "POST") {
      _method = Post;

    } else if (temp_method == "HEAD") {
      _method = Head;

    } else if (temp_method == "PUT") {
      _method = Put;

    } else if (temp_method == "DELETE") {
      _method = Delete;

    } else {
      _method = Invalid;
    }
    return _method != Invalid;
  }